

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<int>>
          (QtPrivate *this,QDebug debug,char *which,QList<int> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  int *piVar3;
  long lVar4;
  _func_int **pp_Var5;
  QString *pQVar6;
  QList<int> *pQVar7;
  int *piVar8;
  QString *this_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = c;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)debug.stream);
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  *(undefined1 *)&pQVar2[3]._vptr_QTextStream = 0;
  if (which == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  else {
    pQVar6 = (QString *)0xffffffffffffffff;
    do {
      this_00 = (QString *)((long)&(pQVar6->d).d + 1);
      pcVar1 = which + 1 + (long)pQVar6;
      pQVar6 = this_00;
    } while (*pcVar1 != '\0');
  }
  ba.m_data = (storage_type *)pQVar7;
  ba.m_size = (qsizetype)which;
  QString::fromUtf8(&local_50,this_00,ba);
  ::QTextStream::operator<<(pQVar2,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar2,' ');
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,'(');
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar2,' ');
  }
  piVar3 = (c->d).ptr;
  lVar4 = (c->d).size;
  piVar8 = piVar3;
  if (lVar4 != 0) {
    ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,*piVar3);
    pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
      ::QTextStream::operator<<(pQVar2,' ');
    }
    piVar8 = piVar3 + 1;
  }
  if (piVar8 != piVar3 + lVar4) {
    do {
      pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      ba_00.m_data = (storage_type *)pQVar7;
      ba_00.m_size = (qsizetype)", ";
      QString::fromUtf8(&local_50,(QString *)0x2,ba_00);
      ::QTextStream::operator<<(pQVar2,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
        ::QTextStream::operator<<(pQVar2,' ');
      }
      ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,*piVar8);
      pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
        ::QTextStream::operator<<(pQVar2,' ');
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar3 + lVar4);
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,')');
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar2,' ');
  }
  pp_Var5 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var5;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}